

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdIsTrue<wabt::interp::Simd<unsigned_long,(unsigned_char)2>,(unsigned_char)2>(Thread *this)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  difference_type dVar3;
  undefined1 local_20 [8];
  Simd<unsigned_long,_(unsigned_char)__x02_> val;
  Thread *this_local;
  
  val.v[1] = (unsigned_long)this;
  _local_20 = Pop<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this);
  puVar1 = std::begin<unsigned_long,2ul>((unsigned_long (*) [2])local_20);
  puVar2 = std::end<unsigned_long,2ul>((unsigned_long (*) [2])local_20);
  dVar3 = std::
          count_if<unsigned_long*,wabt::interp::Thread::DoSimdIsTrue<wabt::interp::Simd<unsigned_long,(unsigned_char)2>,(unsigned_char)2>()::_lambda(unsigned_long)_1_>
                    (puVar1,puVar2);
  Push<bool>(this,1 < dVar3);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdIsTrue() {
  using L = typename S::LaneType;
  auto val = Pop<S>();
  Push(std::count_if(std::begin(val.v), std::end(val.v),
                     [](L x) { return x != 0; }) >= count);
  return RunResult::Ok;
}